

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall
QGraphicsItemPrivate::setFocusHelper
          (QGraphicsItemPrivate *this,FocusReason focusReason,bool climb,bool focusFromHide)

{
  bool bVar1;
  Int IVar2;
  QGraphicsItemPrivate *pQVar3;
  QGraphicsItem *pQVar4;
  QGraphicsItemPrivate *pQVar5;
  QGraphicsItem *pQVar6;
  QGraphicsScenePrivate *this_00;
  byte in_CL;
  byte in_DL;
  QGraphicsItemPrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *p_1;
  QGraphicsItem *commonAncestor;
  QGraphicsItem *oldFocusScopeItem;
  QGraphicsItem *p;
  QGraphicsItem *f;
  GraphicsItemFlag in_stack_ffffffffffffff8c;
  QGraphicsItemPrivate *in_stack_ffffffffffffff90;
  QGraphicsItem *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  QGraphicsItem *in_stack_ffffffffffffffa8;
  QGraphicsItem *in_stack_ffffffffffffffb8;
  QGraphicsItem *in_stack_ffffffffffffffc8;
  QGraphicsItem *local_28;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QGraphicsItem::isEnabled((QGraphicsItem *)0x97b8c6);
  if ((bVar1) && ((*(ulong *)&in_RDI->field_0x160 & 0x400000000) != 0)) {
    local_28 = in_RDI->q_ptr;
    while (pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                    ::operator->(&local_28->d_ptr), pQVar3->focusProxy != (QGraphicsItem *)0x0) {
      pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->(&local_28->d_ptr);
      local_28 = pQVar3->focusProxy;
    }
    if ((in_RDI->scene == (QGraphicsScene *)0x0) ||
       (pQVar4 = QGraphicsScene::focusItem
                           ((QGraphicsScene *)
                            CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0)),
       pQVar4 != local_28)) {
      for (pQVar3 = (QGraphicsItemPrivate *)in_RDI->parent; pQVar3 != (QGraphicsItemPrivate *)0x0;
          pQVar3 = (QGraphicsItemPrivate *)pQVar3->parent) {
        QGraphicsItem::flags((QGraphicsItem *)in_stack_ffffffffffffff90);
        local_c.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
             (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
             QFlags<QGraphicsItem::GraphicsItemFlag>::operator&
                       ((QFlags<QGraphicsItem::GraphicsItemFlag> *)in_stack_ffffffffffffff90,
                        in_stack_ffffffffffffff8c);
        IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
        if (IVar2 != 0) {
          pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                 *)&pQVar3->extras);
          in_stack_ffffffffffffffc8 = pQVar5->focusScopeItem;
          in_stack_ffffffffffffffa8 = in_RDI->q_ptr;
          pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                 *)&pQVar3->extras);
          pQVar5->focusScopeItem = in_stack_ffffffffffffffa8;
          if (in_stack_ffffffffffffffc8 != (QGraphicsItem *)0x0) {
            pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                     ::operator->(&in_stack_ffffffffffffffc8->d_ptr);
            (*pQVar5->_vptr_QGraphicsItemPrivate[9])(pQVar5,0);
          }
          (*in_RDI->_vptr_QGraphicsItemPrivate[9])(in_RDI,1);
          pQVar4 = QGraphicsItem::focusItem((QGraphicsItem *)0x97ba34);
          if ((pQVar4 == (QGraphicsItem *)0x0) && ((in_CL & 1) == 0)) goto LAB_0097bc5e;
          break;
        }
        pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                               *)&pQVar3->extras);
      }
      if ((in_DL & 1) != 0) {
        while( true ) {
          pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->(&local_28->d_ptr);
          bVar1 = false;
          if (pQVar5->focusScopeItem != (QGraphicsItem *)0x0) {
            QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
            operator->(&local_28->d_ptr);
            bVar1 = QGraphicsItem::isVisible((QGraphicsItem *)0x97baab);
          }
          if (bVar1 == false) break;
          pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->(&local_28->d_ptr);
          local_28 = pQVar5->focusScopeItem;
        }
        in_stack_ffffffffffffffa7 = 0;
      }
      pQVar4 = (QGraphicsItem *)0x0;
      if ((in_RDI->scene != (QGraphicsScene *)0x0) &&
         (pQVar6 = QGraphicsScene::focusItem
                             ((QGraphicsScene *)
                              CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0)),
         pQVar6 != (QGraphicsItem *)0x0)) {
        QGraphicsScene::focusItem
                  ((QGraphicsScene *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
        in_stack_ffffffffffffff98 = QGraphicsItem::panel(in_stack_ffffffffffffff98);
        pQVar6 = QGraphicsItem::panel(in_stack_ffffffffffffff98);
        if (in_stack_ffffffffffffff98 == pQVar6) {
          QGraphicsScene::focusItem
                    ((QGraphicsScene *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0)
                    );
          pQVar4 = QGraphicsItem::commonAncestorItem
                             (in_stack_ffffffffffffffb8,(QGraphicsItem *)in_RDI);
          pQVar6 = QGraphicsScene::focusItem
                             ((QGraphicsScene *)
                              CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
          in_stack_ffffffffffffff90 =
               QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->(&pQVar6->d_ptr);
          QGraphicsScene::focusItem
                    ((QGraphicsScene *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0)
                    );
          clearSubFocus(in_RDI,in_stack_ffffffffffffffa8,
                        (QGraphicsItem *)
                        CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
        }
      }
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                (&local_28->d_ptr);
      setSubFocus(pQVar3,in_stack_ffffffffffffffc8,pQVar4);
      if ((in_RDI->scene != (QGraphicsScene *)0x0) &&
         (((this_00 = (QGraphicsScenePrivate *)QGraphicsItem::panel(in_stack_ffffffffffffff98),
           this_00 == (QGraphicsScenePrivate *)0x0 &&
           (bVar1 = QGraphicsScene::isActive((QGraphicsScene *)in_stack_ffffffffffffff90), bVar1))
          || ((this_00 != (QGraphicsScenePrivate *)0x0 &&
              (bVar1 = QGraphicsItem::isActive(in_stack_ffffffffffffff98), bVar1)))))) {
        QGraphicsScene::d_func((QGraphicsScene *)0x97bc46);
        QGraphicsScenePrivate::setFocusItemHelper
                  (this_00,(QGraphicsItem *)in_RDI,
                   (FocusReason)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                   SUB81((ulong)in_stack_ffffffffffffffa8 >> 0x18,0));
      }
    }
  }
LAB_0097bc5e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItemPrivate::setFocusHelper(Qt::FocusReason focusReason, bool climb, bool focusFromHide)
{
    // Disabled / unfocusable items cannot accept focus.
    if (!q_ptr->isEnabled() || !(flags & QGraphicsItem::ItemIsFocusable))
        return;

    // Find focus proxy.
    QGraphicsItem *f = q_ptr;
    while (f->d_ptr->focusProxy)
        f = f->d_ptr->focusProxy;

    // Return if it already has focus.
    if (scene && scene->focusItem() == f)
        return;

    // Update focus scope item ptr.
    QGraphicsItem *p = parent;
    while (p) {
        if (p->flags() & QGraphicsItem::ItemIsFocusScope) {
            QGraphicsItem *oldFocusScopeItem = p->d_ptr->focusScopeItem;
            p->d_ptr->focusScopeItem = q_ptr;
            if (oldFocusScopeItem)
                oldFocusScopeItem->d_ptr->focusScopeItemChange(false);
            focusScopeItemChange(true);
            if (!p->focusItem() && !focusFromHide) {
                // Calling setFocus() on a child of a focus scope that does
                // not have focus changes only the focus scope pointer,
                // so that focus is restored the next time the scope gains
                // focus.
                return;
            }
            break;
        }
        p = p->d_ptr->parent;
    }

    if (climb) {
        while (f->d_ptr->focusScopeItem && f->d_ptr->focusScopeItem->isVisible())
            f = f->d_ptr->focusScopeItem;
    }

    // Update the child focus chain.
    QGraphicsItem *commonAncestor = nullptr;
    if (scene && scene->focusItem() && scene->focusItem()->panel() == q_ptr->panel()) {
        commonAncestor = scene->focusItem()->commonAncestorItem(f);
        scene->focusItem()->d_ptr->clearSubFocus(scene->focusItem(), commonAncestor);
    }

    f->d_ptr->setSubFocus(f, commonAncestor);

    // Update the scene's focus item.
    if (scene) {
        QGraphicsItem *p = q_ptr->panel();
        if ((!p && scene->isActive()) || (p && p->isActive())) {
            // Visible items immediately gain focus from scene.
            scene->d_func()->setFocusItemHelper(f, focusReason);
        }
    }
}